

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::AdapterPromiseNode<kj::Promise<void>,_capnp::LocalClient::BlockedCall>::fulfill
          (AdapterPromiseNode<kj::Promise<void>,_capnp::LocalClient::BlockedCall> *this,
          Promise<void> *value)

{
  ExceptionOr<kj::Promise<void>_> local_1b0;
  
  if (this->waiting == true) {
    this->waiting = false;
    local_1b0.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_1b0.value.ptr.isSet = true;
    local_1b0.value.ptr.field_1.value.super_PromiseBase.node.ptr =
         (Promise<void>)(value->super_PromiseBase).node.ptr;
    (value->super_PromiseBase).node.ptr = (PromiseNode *)0x0;
    ExceptionOr<kj::Promise<void>_>::operator=(&this->result,&local_1b0);
    ExceptionOr<kj::Promise<void>_>::~ExceptionOr(&local_1b0);
    PromiseNode::OnReadyEvent::arm(&(this->super_AdapterPromiseNodeBase).onReadyEvent);
  }
  return;
}

Assistant:

void fulfill(T&& value) override {
    if (waiting) {
      waiting = false;
      result = ExceptionOr<T>(kj::mv(value));
      setReady();
    }
  }